

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_file_server.cpp
# Opt level: O1

int module_unload(Server *server)

{
  long *plVar1;
  _Rb_tree_node_base *p_Var2;
  size_t __n;
  long *__dest;
  
  puts("Unloading module FileServer...");
  for (p_Var2 = filename_to_buffer_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &filename_to_buffer_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
      ; p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    if (p_Var2[3]._M_parent != (_Base_ptr)0x0) {
      operator_delete__(p_Var2[3]._M_parent);
    }
  }
  __dest = *(long **)server;
  plVar1 = *(long **)(server + 8);
  if (__dest != plVar1) {
    __n = (long)plVar1 - (long)__dest;
    do {
      __n = __n - 8;
      if ((code *)*__dest == http_request_handler) {
        if (__dest + 1 != plVar1) {
          memmove(__dest,__dest + 1,__n);
        }
        *(long *)(server + 8) = *(long *)(server + 8) + -8;
        break;
      }
      __dest = __dest + 1;
    } while (__dest != plVar1);
  }
  puts("Unloaded module FileServer");
  return 0;
}

Assistant:

int module_unload(Server *server) {
    printf("Unloading module FileServer...\n");
    unload_file_from_mem();
    Server::remove_from_hook(server->http_request_hook, &http_request_handler);
    printf("Unloaded module FileServer\n");
    return 0;
}